

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O1

TonkResult tonk_inject(TonkSocket tonkSocket,uint16_t sourcePort,void *data,uint32_t bytes)

{
  TonkResult TVar1;
  
  if (fp_tonk_inject != (fp_tonk_inject_t)0x0) {
    TVar1 = (*fp_tonk_inject)(tonkSocket,sourcePort,data,bytes);
    return TVar1;
  }
  return Tonk_DLL_Not_Found;
}

Assistant:

TonkResult tonk_inject(
    TonkSocket   tonkSocket, ///< [in] Socket to inject
    uint16_t     sourcePort, ///< [in] Source port of datagram
    const void*        data, ///< [in] Datagram data
    uint32_t          bytes  ///< [in] Datagram bytes
)
{
    if (!fp_tonk_inject) {
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_inject(
        tonkSocket,
        sourcePort,
        data,
        bytes);
}